

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int rd_pick_filter_intra_sby
              (AV1_COMP *cpi,MACROBLOCK *x,int *rate,int *rate_tokenonly,int64_t *distortion,
              uint8_t *skippable,BLOCK_SIZE bsize,int mode_cost,PREDICTION_MODE best_mode_so_far,
              int64_t *best_rd,int64_t *best_model_rd,PICK_MODE_CONTEXT *ctx)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t *in_R8;
  undefined1 *in_R9;
  MACROBLOCK *x_00;
  double dVar3;
  byte in_stack_00000018;
  long *in_stack_00000020;
  long in_stack_00000030;
  int txfm_search_done;
  int this_rate;
  RD_STATS tokenonly_rd_stats;
  int64_t this_rd;
  uint8_t best_tx_type_map [1024];
  FILTER_INTRA_MODE_INFO filter_intra_mode_info;
  TX_SIZE best_tx_size;
  FILTER_INTRA_MODE mode;
  int filter_intra_selected_flag;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMP *in_stack_fffffffffffffb40;
  BLOCK_SIZE in_stack_fffffffffffffb4f;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  undefined7 in_stack_fffffffffffffb58;
  BLOCK_SIZE in_stack_fffffffffffffb5f;
  undefined4 in_stack_fffffffffffffb68;
  int local_488;
  int64_t in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  BLOCK_SIZE in_stack_fffffffffffffb8f;
  RD_STATS *in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffb99;
  AV1_COMP *in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  AV1_COMMON *in_stack_fffffffffffffbb0;
  MACROBLOCK *in_stack_fffffffffffffbb8;
  THR_MODES in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc1;
  uint8_t *in_stack_fffffffffffffbc8;
  BLOCK_SIZE in_stack_fffffffffffffbd0;
  int64_t in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe8;
  undefined2 local_50;
  undefined1 local_4e;
  byte local_4d;
  int local_4c;
  long local_48;
  long local_40;
  undefined1 *local_38;
  int64_t *local_30;
  int *local_28;
  int *local_20;
  long local_18;
  long local_10;
  int local_4;
  
  if (*(int *)(in_RDI + 0x60b98) == 2) {
    local_4 = 0;
  }
  else {
    local_40 = in_RSI + 0x1a0;
    local_48 = **(long **)(in_RSI + 0x2058);
    local_4c = 0;
    local_4e = 1;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(&local_50,0,2);
    *(undefined1 *)(local_48 + 0x5b) = 1;
    *(undefined1 *)(local_48 + 2) = 0;
    *(undefined1 *)(local_48 + 0x8e) = 0;
    if ((*(int *)(local_18 + 0x1f6a8) == 0) ||
       (*(char *)(*(long *)(local_18 + 0x1f6b0) + 0x5b) != '\0')) {
      for (local_4d = 0; local_4d < 5; local_4d = local_4d + 1) {
        *(byte *)(local_48 + 0x5a) = local_4d;
        if ((((*(int *)(local_10 + 0x60b98) != 1) ||
             (((uint)"\x01\x03\x05\x01\x01\x01\t\x01\x01\x01\x01\x01\x11"[in_stack_00000018] &
              1 << (local_4d & 0x1f)) != 0)) &&
            ((*(int *)(local_18 + 0x1f6a8) == 0 ||
             (local_4d == *(byte *)(*(long *)(local_18 + 0x1f6b0) + 0x5a))))) &&
           ((iVar1 = model_intra_yrd_and_prune
                               ((AV1_COMP *)
                                CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                                (MACROBLOCK *)
                                CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                                in_stack_fffffffffffffb4f,(int64_t *)in_stack_fffffffffffffb40),
            iVar1 == 0 &&
            (av1_pick_uniform_tx_size_type_yrd
                       (in_stack_fffffffffffffba0,
                        (MACROBLOCK *)CONCAT71(in_stack_fffffffffffffb99,in_stack_fffffffffffffb98),
                        in_stack_fffffffffffffb90,in_stack_fffffffffffffb8f,
                        in_stack_fffffffffffffb80), local_488 != 0x7fffffff)))) {
          iVar1 = local_488;
          iVar2 = intra_mode_info_cost_y
                            ((AV1_COMP *)
                             CONCAT71(in_stack_fffffffffffffbc1,in_stack_fffffffffffffbc0),
                             in_stack_fffffffffffffbb8,(MB_MODE_INFO *)in_stack_fffffffffffffbb0,
                             (BLOCK_SIZE)((uint)in_stack_fffffffffffffbac >> 0x18),
                             in_stack_fffffffffffffba8,
                             (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
          in_stack_fffffffffffffb40 =
               (AV1_COMP *)
               (((long)(iVar1 + iVar2) * (long)*(int *)(local_18 + 0x4218) + 0x100 >> 9) +
               in_stack_fffffffffffffb80 * 0x80);
          if ((*(char *)(local_10 + 0x42770) == '\x02') &&
             (in_stack_fffffffffffffb40 != (AV1_COMP *)0x7fffffffffffffff)) {
            x_00 = (MACROBLOCK *)(double)(long)in_stack_fffffffffffffb40;
            dVar3 = intra_rd_variance_factor
                              ((AV1_COMP *)CONCAT44(iVar1,in_stack_fffffffffffffb68),x_00,
                               in_stack_fffffffffffffb5f);
            in_stack_fffffffffffffb40 = (AV1_COMP *)(long)((double)x_00 * dVar3);
          }
          in_stack_fffffffffffffb50 = 1;
          in_stack_fffffffffffffba0 = in_stack_fffffffffffffb40;
          store_winner_mode_stats
                    (in_stack_fffffffffffffbb0,
                     (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                     (MB_MODE_INFO *)in_stack_fffffffffffffb40,
                     (RD_STATS *)CONCAT71(in_stack_fffffffffffffb99,in_stack_fffffffffffffb98),
                     in_stack_fffffffffffffb90,
                     (RD_STATS *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88),
                     in_stack_fffffffffffffbc0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbd8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8);
          if ((long)in_stack_fffffffffffffba0 < *in_stack_00000020) {
            *in_stack_00000020 = (long)in_stack_fffffffffffffba0;
            local_4e = *(undefined1 *)(local_48 + 0x91);
            local_50 = *(undefined2 *)(local_48 + 0x5a);
            memcpy(&stack0xfffffffffffffba8,*(void **)(local_40 + 0x1ee8),
                   (long)*(int *)(in_stack_00000030 + 0x1a0));
            memcpy(*(void **)(in_stack_00000030 + 0x118),(void *)(local_18 + 0x24e09),
                   (long)*(int *)(in_stack_00000030 + 0x1a0));
            *local_20 = iVar1 + iVar2;
            *local_28 = local_488;
            *local_30 = in_stack_fffffffffffffb80;
            *local_38 = in_stack_fffffffffffffb98;
            local_4c = 1;
          }
        }
      }
      if (local_4c == 0) {
        local_4 = 0;
      }
      else {
        *(undefined1 *)(local_48 + 2) = 0;
        *(undefined1 *)(local_48 + 0x91) = local_4e;
        *(undefined2 *)(local_48 + 0x5a) = local_50;
        memcpy(*(void **)(in_stack_00000030 + 0x198),&stack0xfffffffffffffba8,
               (long)*(int *)(in_stack_00000030 + 0x1a0));
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int rd_pick_filter_intra_sby(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    int *rate, int *rate_tokenonly,
                                    int64_t *distortion, uint8_t *skippable,
                                    BLOCK_SIZE bsize, int mode_cost,
                                    PREDICTION_MODE best_mode_so_far,
                                    int64_t *best_rd, int64_t *best_model_rd,
                                    PICK_MODE_CONTEXT *ctx) {
  // Skip the evaluation of filter intra modes.
  if (cpi->sf.intra_sf.prune_filter_intra_level == 2) return 0;

  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  int filter_intra_selected_flag = 0;
  FILTER_INTRA_MODE mode;
  TX_SIZE best_tx_size = TX_8X8;
  FILTER_INTRA_MODE_INFO filter_intra_mode_info;
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  av1_zero(filter_intra_mode_info);
  mbmi->filter_intra_mode_info.use_filter_intra = 1;
  mbmi->mode = DC_PRED;
  mbmi->palette_mode_info.palette_size[0] = 0;

  // Skip the evaluation of filter-intra if cached MB_MODE_INFO does not have
  // filter-intra as winner.
  if (x->use_mb_mode_cache &&
      !x->mb_mode_cache->filter_intra_mode_info.use_filter_intra)
    return 0;

  for (mode = 0; mode < FILTER_INTRA_MODES; ++mode) {
    int64_t this_rd;
    RD_STATS tokenonly_rd_stats;
    mbmi->filter_intra_mode_info.filter_intra_mode = mode;

    if ((cpi->sf.intra_sf.prune_filter_intra_level == 1) &&
        !(av1_derived_filter_intra_mode_used_flag[best_mode_so_far] &
          (1 << mode)))
      continue;

    // Skip the evaluation of modes that do not match with the winner mode in
    // x->mb_mode_cache.
    if (x->use_mb_mode_cache &&
        mode != x->mb_mode_cache->filter_intra_mode_info.filter_intra_mode)
      continue;

    if (model_intra_yrd_and_prune(cpi, x, bsize, best_model_rd)) {
      continue;
    }
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &tokenonly_rd_stats, bsize,
                                      *best_rd);
    if (tokenonly_rd_stats.rate == INT_MAX) continue;
    const int this_rate =
        tokenonly_rd_stats.rate +
        intra_mode_info_cost_y(cpi, x, mbmi, bsize, mode_cost, 0);
    this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);

    // Visual quality adjustment based on recon vs source variance.
    if ((cpi->oxcf.mode == ALLINTRA) && (this_rd != INT64_MAX)) {
      this_rd = (int64_t)(this_rd * intra_rd_variance_factor(cpi, x, bsize));
    }

    // Collect mode stats for multiwinner mode processing
    const int txfm_search_done = 1;
    store_winner_mode_stats(
        &cpi->common, x, mbmi, NULL, NULL, NULL, 0, NULL, bsize, this_rd,
        cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
    if (this_rd < *best_rd) {
      *best_rd = this_rd;
      best_tx_size = mbmi->tx_size;
      filter_intra_mode_info = mbmi->filter_intra_mode_info;
      av1_copy_array(best_tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
      memcpy(ctx->blk_skip, x->txfm_search_info.blk_skip,
             sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
      *rate = this_rate;
      *rate_tokenonly = tokenonly_rd_stats.rate;
      *distortion = tokenonly_rd_stats.dist;
      *skippable = tokenonly_rd_stats.skip_txfm;
      filter_intra_selected_flag = 1;
    }
  }

  if (filter_intra_selected_flag) {
    mbmi->mode = DC_PRED;
    mbmi->tx_size = best_tx_size;
    mbmi->filter_intra_mode_info = filter_intra_mode_info;
    av1_copy_array(ctx->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
    return 1;
  } else {
    return 0;
  }
}